

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O0

XMLSize_t __thiscall xercesc_4_0::ElemStack::addChild(ElemStack *this,QName *child,bool toParent)

{
  XMLSize_t XVar1;
  int iVar2;
  EmptyStackException *this_00;
  NoSuchElementException *this_01;
  undefined4 extraout_var;
  double dVar3;
  undefined1 auVar4 [16];
  ulong local_78;
  StackElem *local_70;
  ulong local_50;
  XMLSize_t index;
  QName **newRow;
  XMLSize_t newCapacity;
  StackElem *curRow;
  bool toParent_local;
  QName *child_local;
  ElemStack *this_local;
  
  if (this->fStackTop == 0) {
    this_00 = (EmptyStackException *)__cxa_allocate_exception(0x30);
    EmptyStackException::EmptyStackException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ElemStack.cpp"
               ,200,ElemStack_EmptyStack,this->fMemoryManager);
    __cxa_throw(this_00,&EmptyStackException::typeinfo,EmptyStackException::~EmptyStackException);
  }
  if ((toParent) && (this->fStackTop < 2)) {
    this_01 = (NoSuchElementException *)__cxa_allocate_exception(0x30);
    NoSuchElementException::NoSuchElementException
              (this_01,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ElemStack.cpp"
               ,0xcf,ElemStack_NoParentPushed,this->fMemoryManager);
    __cxa_throw(this_01,&NoSuchElementException::typeinfo,
                NoSuchElementException::~NoSuchElementException);
  }
  if (toParent) {
    local_70 = this->fStack[this->fStackTop - 2];
  }
  else {
    local_70 = this->fStack[this->fStackTop - 1];
  }
  if (local_70->fChildCount == local_70->fChildCapacity) {
    if (local_70->fChildCapacity == 0) {
      local_78 = 0x20;
    }
    else {
      XVar1 = local_70->fChildCapacity;
      auVar4._8_4_ = (int)(XVar1 >> 0x20);
      auVar4._0_8_ = XVar1;
      auVar4._12_4_ = 0x45300000;
      dVar3 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)XVar1) - 4503599627370496.0)) * 1.25;
      local_78 = (ulong)dVar3;
      local_78 = local_78 | (long)(dVar3 - 9.223372036854776e+18) & (long)local_78 >> 0x3f;
    }
    iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,local_78 << 3);
    for (local_50 = 0; local_50 < local_70->fChildCount; local_50 = local_50 + 1) {
      ((QName **)CONCAT44(extraout_var,iVar2))[local_50] = local_70->fChildren[local_50];
    }
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,local_70->fChildren);
    local_70->fChildren = (QName **)CONCAT44(extraout_var,iVar2);
    local_70->fChildCapacity = local_78;
  }
  XVar1 = local_70->fChildCount;
  local_70->fChildCount = XVar1 + 1;
  local_70->fChildren[XVar1] = child;
  return local_70->fChildCount - 1;
}

Assistant:

XMLSize_t ElemStack::addChild(QName* const child, const bool toParent)
{
    if (!fStackTop)
        ThrowXMLwithMemMgr(EmptyStackException, XMLExcepts::ElemStack_EmptyStack, fMemoryManager);

    //
    //  If they want to add to the parent, then we have to have at least two
    //  elements on the stack.
    //
    if (toParent && (fStackTop < 2))
        ThrowXMLwithMemMgr(NoSuchElementException, XMLExcepts::ElemStack_NoParentPushed, fMemoryManager);

    // Get a convenience pointer to the stack top row
    StackElem* curRow = toParent
                        ? fStack[fStackTop - 2] : fStack[fStackTop - 1];

    // See if we need to expand this row's child array
    if (curRow->fChildCount == curRow->fChildCapacity)
    {
        // Increase the capacity by a quarter and allocate a new row
        const XMLSize_t newCapacity = curRow->fChildCapacity ?
                                      (XMLSize_t)(curRow->fChildCapacity * 1.25) :
                                      32;
        QName** newRow = (QName**) fMemoryManager->allocate
        (
            newCapacity * sizeof(QName*)
        );//new QName*[newCapacity];

        //
        //  Copy over the old contents. We don't have to initialize the new
        //  part because The current child count is used to know how much of
        //  it is valid.
        //
        //  Only both doing this if there is any current content, since
        //  this code also does the initial faulting in of the array when
        //  both the current capacity and child count are zero.
        //
        for (XMLSize_t index = 0; index < curRow->fChildCount; index++)
            newRow[index] = curRow->fChildren[index];

        // Clean up the old children and store the new info
        fMemoryManager->deallocate(curRow->fChildren);//delete [] curRow->fChildren;
        curRow->fChildren = newRow;
        curRow->fChildCapacity = newCapacity;
    }

    // Add this id to the end of the row's child id array and bump the count
    curRow->fChildren[curRow->fChildCount++] = child;

    // Return the level of the index we just filled (before the bump)
    return curRow->fChildCount - 1;
}